

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

void helper_stctl(CPUS390XState_conflict *env,uint32_t r1,uint64_t a2,uint32_t r3)

{
  uintptr_t unaff_retaddr;
  
  if ((a2 & 3) != 0) {
    tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
  }
  for (; cpu_stl_data_ra_s390x(env,a2,(uint32_t)env->cregs[r1],unaff_retaddr), r1 != r3;
      r1 = r1 + 1 & 0xf) {
    a2 = a2 + 4;
  }
  return;
}

Assistant:

void HELPER(stctl)(CPUS390XState *env, uint32_t r1, uint64_t a2, uint32_t r3)
{
    uintptr_t ra = GETPC();
    uint64_t dest = a2;
    uint32_t i;

    if (dest & 0x3) {
        tcg_s390_program_interrupt(env, PGM_SPECIFICATION, ra);
    }

    for (i = r1;; i = (i + 1) % 16) {
        cpu_stl_data_ra(env, dest, env->cregs[i], ra);
        dest += sizeof(uint32_t);

        if (i == r3) {
            break;
        }
    }
}